

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textbox_base.cpp
# Opt level: O1

void __thiscall
cppurses::detail::Textbox_base::Textbox_base(Textbox_base *this,Glyph_string *contents)

{
  less<int> local_43;
  Optional_last_value<void> local_42;
  undefined1 local_41;
  vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_> local_40;
  
  std::vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>::vector
            (&local_40,&contents->super_vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>);
  Text_display::Text_display(&this->super_Text_display,(Glyph_string *)&local_40);
  std::vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>::~vector(&local_40);
  (this->super_Text_display).super_Widget._vptr_Widget = (_func_int **)&PTR__Textbox_base_00165fa0;
  (this->cursor_moved_left).pimpl_.
  super___shared_ptr<sig::Signal_impl<void_(unsigned_long),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_(unsigned_long)>,_std::mutex>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<sig::Signal_impl<void(unsigned_long),sig::Optional_last_value<void>,int,std::less<int>,std::function<void(unsigned_long)>,std::mutex>,std::allocator<sig::Signal_impl<void(unsigned_long),sig::Optional_last_value<void>,int,std::less<int>,std::function<void(unsigned_long)>,std::mutex>>,sig::Optional_last_value<void>const&,std::less<int>const&>
            (&(this->cursor_moved_left).pimpl_.
              super___shared_ptr<sig::Signal_impl<void_(unsigned_long),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_(unsigned_long)>,_std::mutex>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,
             (Signal_impl<void_(unsigned_long),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_(unsigned_long)>,_std::mutex>
              **)&this->cursor_moved_left,
             (allocator<sig::Signal_impl<void_(unsigned_long),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_(unsigned_long)>,_std::mutex>_>
              *)&local_41,&local_42,&local_43);
  (this->cursor_moved_right).pimpl_.
  super___shared_ptr<sig::Signal_impl<void_(unsigned_long),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_(unsigned_long)>,_std::mutex>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<sig::Signal_impl<void(unsigned_long),sig::Optional_last_value<void>,int,std::less<int>,std::function<void(unsigned_long)>,std::mutex>,std::allocator<sig::Signal_impl<void(unsigned_long),sig::Optional_last_value<void>,int,std::less<int>,std::function<void(unsigned_long)>,std::mutex>>,sig::Optional_last_value<void>const&,std::less<int>const&>
            (&(this->cursor_moved_right).pimpl_.
              super___shared_ptr<sig::Signal_impl<void_(unsigned_long),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_(unsigned_long)>,_std::mutex>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,
             (Signal_impl<void_(unsigned_long),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_(unsigned_long)>,_std::mutex>
              **)&this->cursor_moved_right,
             (allocator<sig::Signal_impl<void_(unsigned_long),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_(unsigned_long)>,_std::mutex>_>
              *)&local_41,&local_42,&local_43);
  (this->cursor_moved_up).pimpl_.
  super___shared_ptr<sig::Signal_impl<void_(unsigned_long),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_(unsigned_long)>,_std::mutex>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<sig::Signal_impl<void(unsigned_long),sig::Optional_last_value<void>,int,std::less<int>,std::function<void(unsigned_long)>,std::mutex>,std::allocator<sig::Signal_impl<void(unsigned_long),sig::Optional_last_value<void>,int,std::less<int>,std::function<void(unsigned_long)>,std::mutex>>,sig::Optional_last_value<void>const&,std::less<int>const&>
            (&(this->cursor_moved_up).pimpl_.
              super___shared_ptr<sig::Signal_impl<void_(unsigned_long),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_(unsigned_long)>,_std::mutex>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,
             (Signal_impl<void_(unsigned_long),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_(unsigned_long)>,_std::mutex>
              **)&this->cursor_moved_up,
             (allocator<sig::Signal_impl<void_(unsigned_long),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_(unsigned_long)>,_std::mutex>_>
              *)&local_41,&local_42,&local_43);
  (this->cursor_moved_down).pimpl_.
  super___shared_ptr<sig::Signal_impl<void_(unsigned_long),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_(unsigned_long)>,_std::mutex>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<sig::Signal_impl<void(unsigned_long),sig::Optional_last_value<void>,int,std::less<int>,std::function<void(unsigned_long)>,std::mutex>,std::allocator<sig::Signal_impl<void(unsigned_long),sig::Optional_last_value<void>,int,std::less<int>,std::function<void(unsigned_long)>,std::mutex>>,sig::Optional_last_value<void>const&,std::less<int>const&>
            (&(this->cursor_moved_down).pimpl_.
              super___shared_ptr<sig::Signal_impl<void_(unsigned_long),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_(unsigned_long)>,_std::mutex>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,
             (Signal_impl<void_(unsigned_long),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_(unsigned_long)>,_std::mutex>
              **)&this->cursor_moved_down,
             (allocator<sig::Signal_impl<void_(unsigned_long),_sig::Optional_last_value<void>,_int,_std::less<int>,_std::function<void_(unsigned_long)>,_std::mutex>_>
              *)&local_41,&local_42,&local_43);
  (this->super_Text_display).super_Widget.cursor.enabled_ = true;
  return;
}

Assistant:

Textbox_base::Textbox_base(Glyph_string contents)
    : Text_display{std::move(contents)} {
    this->cursor.enable();
}